

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

DescriptorKeyReference * __thiscall
cfd::core::DescriptorKeyReference::operator=
          (DescriptorKeyReference *this,DescriptorKeyReference *object)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  NetType NVar5;
  
  if (this != object) {
    this->key_type_ = object->key_type_;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->pubkey_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->schnorr_pubkey_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->extprivkey_);
    uVar1 = (object->extprivkey_).fingerprint_;
    uVar2 = (object->extprivkey_).depth_;
    uVar3 = *(undefined3 *)&(object->extprivkey_).field_0x21;
    uVar4 = (object->extprivkey_).child_num_;
    (this->extprivkey_).version_ = (object->extprivkey_).version_;
    (this->extprivkey_).fingerprint_ = uVar1;
    (this->extprivkey_).depth_ = uVar2;
    *(undefined3 *)&(this->extprivkey_).field_0x21 = uVar3;
    (this->extprivkey_).child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->extprivkey_).chaincode_.data_,&(object->extprivkey_).chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->extprivkey_).privkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->extprivkey_).privkey_);
    uVar3 = *(undefined3 *)&(object->extprivkey_).privkey_.field_0x19;
    NVar5 = (object->extprivkey_).privkey_.net_type_;
    (this->extprivkey_).privkey_.is_compressed_ = (object->extprivkey_).privkey_.is_compressed_;
    *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19 = uVar3;
    (this->extprivkey_).privkey_.net_type_ = NVar5;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->extprivkey_).tweak_sum_.data_,&(object->extprivkey_).tweak_sum_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->extpubkey_);
    uVar1 = (object->extpubkey_).fingerprint_;
    uVar2 = (object->extpubkey_).depth_;
    uVar3 = *(undefined3 *)&(object->extpubkey_).field_0x21;
    uVar4 = (object->extpubkey_).child_num_;
    (this->extpubkey_).version_ = (object->extpubkey_).version_;
    (this->extpubkey_).fingerprint_ = uVar1;
    (this->extpubkey_).depth_ = uVar2;
    *(undefined3 *)&(this->extpubkey_).field_0x21 = uVar3;
    (this->extpubkey_).child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->extpubkey_).chaincode_.data_,&(object->extpubkey_).chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->extpubkey_).pubkey_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->extpubkey_).tweak_sum_.data_,&(object->extpubkey_).tweak_sum_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->key_data_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->key_data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->key_data_).privkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->key_data_).privkey_);
    uVar3 = *(undefined3 *)&(object->key_data_).privkey_.field_0x19;
    NVar5 = (object->key_data_).privkey_.net_type_;
    (this->key_data_).privkey_.is_compressed_ = (object->key_data_).privkey_.is_compressed_;
    *(undefined3 *)&(this->key_data_).privkey_.field_0x19 = uVar3;
    (this->key_data_).privkey_.net_type_ = NVar5;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->key_data_).extprivkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->key_data_).extprivkey_);
    uVar1 = (object->key_data_).extprivkey_.fingerprint_;
    uVar2 = (object->key_data_).extprivkey_.depth_;
    uVar3 = *(undefined3 *)&(object->key_data_).extprivkey_.field_0x21;
    uVar4 = (object->key_data_).extprivkey_.child_num_;
    (this->key_data_).extprivkey_.version_ = (object->key_data_).extprivkey_.version_;
    (this->key_data_).extprivkey_.fingerprint_ = uVar1;
    (this->key_data_).extprivkey_.depth_ = uVar2;
    *(undefined3 *)&(this->key_data_).extprivkey_.field_0x21 = uVar3;
    (this->key_data_).extprivkey_.child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->key_data_).extprivkey_.chaincode_.data_,
               &(object->key_data_).extprivkey_.chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->key_data_).extprivkey_.privkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->key_data_).extprivkey_.privkey_);
    uVar3 = *(undefined3 *)&(object->key_data_).extprivkey_.privkey_.field_0x19;
    NVar5 = (object->key_data_).extprivkey_.privkey_.net_type_;
    (this->key_data_).extprivkey_.privkey_.is_compressed_ =
         (object->key_data_).extprivkey_.privkey_.is_compressed_;
    *(undefined3 *)&(this->key_data_).extprivkey_.privkey_.field_0x19 = uVar3;
    (this->key_data_).extprivkey_.privkey_.net_type_ = NVar5;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->key_data_).extprivkey_.tweak_sum_.data_,
               &(object->key_data_).extprivkey_.tweak_sum_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->key_data_).extpubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->key_data_).extpubkey_);
    uVar1 = (object->key_data_).extpubkey_.fingerprint_;
    uVar2 = (object->key_data_).extpubkey_.depth_;
    uVar3 = *(undefined3 *)&(object->key_data_).extpubkey_.field_0x21;
    uVar4 = (object->key_data_).extpubkey_.child_num_;
    (this->key_data_).extpubkey_.version_ = (object->key_data_).extpubkey_.version_;
    (this->key_data_).extpubkey_.fingerprint_ = uVar1;
    (this->key_data_).extpubkey_.depth_ = uVar2;
    *(undefined3 *)&(this->key_data_).extpubkey_.field_0x21 = uVar3;
    (this->key_data_).extpubkey_.child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->key_data_).extpubkey_.chaincode_.data_,
               &(object->key_data_).extpubkey_.chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->key_data_).extpubkey_.pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(object->key_data_).extpubkey_.pubkey_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->key_data_).extpubkey_.tweak_sum_.data_,
               &(object->key_data_).extpubkey_.tweak_sum_.data_);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(this->key_data_).path_,&(object->key_data_).path_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->key_data_).fingerprint_.data_,&(object->key_data_).fingerprint_.data_);
    ::std::__cxx11::string::_M_assign((string *)&this->argument_);
  }
  return this;
}

Assistant:

DescriptorKeyReference& DescriptorKeyReference::operator=(
    const DescriptorKeyReference& object) {
  if (this != &object) {
    key_type_ = object.key_type_;
    pubkey_ = object.pubkey_;
    schnorr_pubkey_ = object.schnorr_pubkey_;
    extprivkey_ = object.extprivkey_;
    extpubkey_ = object.extpubkey_;
    key_data_ = object.key_data_;
    argument_ = object.argument_;
  }
  return *this;
}